

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::PrepareBlockFilterRequest
          (PeerManagerImpl *this,CNode *node,Peer *peer,BlockFilterType filter_type,
          uint32_t start_height,uint256 *stop_hash,uint32_t max_height_diff,CBlockIndex **stop_index
          ,BlockFilterIndex **filter_index)

{
  uint uVar1;
  uint32_t uVar2;
  CBlockIndex **ppCVar3;
  BlockFilterIndex **ppBVar4;
  bool bVar5;
  CBlockIndex *pindex;
  Logger *pLVar6;
  BlockFilterIndex *pBVar7;
  string *args;
  undefined7 in_register_00000009;
  int source_line;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  char *fmt;
  uint32_t *args_1;
  unique_lock<std::recursive_mutex> *this_00;
  NodeId local_78;
  uint32_t start_height_local;
  uint32_t stop_height;
  undefined4 uStack_64;
  bool local_60;
  string local_58;
  long local_38;
  
  uVar2 = max_height_diff;
  args_1 = (uint32_t *)&local_78;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  start_height_local = start_height;
  if (((int)CONCAT71(in_register_00000009,filter_type) == 0 & (byte)(((uint)peer & 0x40) >> 6)) == 0
     ) {
    pLVar6 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
    if (bVar5) {
      local_58._M_dataplus._M_p = (pointer)node->id;
      _stop_height = (RecursiveMutex *)CONCAT71(stack0xffffffffffffff99,filter_type);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x62;
      logging_function._M_str = "PrepareBlockFilterRequest";
      logging_function._M_len = 0x19;
      LogPrintFormatInternal<long,unsigned_char>
                (logging_function,source_file,0xd7e,NET,Debug,(ConstevalFormatString<2U>)0xf7d06d,
                 (long *)&local_58,(uchar *)&stop_height);
    }
    goto LAB_008f418f;
  }
  _stop_height = &cs_main;
  local_60 = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&stop_height);
  pindex = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,stop_hash);
  ppCVar3 = stop_index;
  *stop_index = pindex;
  if (pindex == (CBlockIndex *)0x0) {
LAB_008f419c:
    pLVar6 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
    if (bVar5) {
      local_78 = node->id;
      base_blob<256u>::ToString_abi_cxx11_(&local_58,stop_hash);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file_00._M_len = 0x62;
      logging_function_00._M_str = "PrepareBlockFilterRequest";
      logging_function_00._M_len = 0x19;
      LogPrintFormatInternal<long,std::__cxx11::string>
                (logging_function_00,source_file_00,0xd8a,NET,Debug,
                 (ConstevalFormatString<2U>)0xf7d0a2,&local_78,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    LOCK();
    (node->fDisconnect)._M_base._M_i = true;
    UNLOCK();
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stop_height);
  }
  else {
    bVar5 = BlockRequestAllowed(this,pindex);
    if (!bVar5) goto LAB_008f419c;
    this_00 = (unique_lock<std::recursive_mutex> *)&stop_height;
    std::unique_lock<std::recursive_mutex>::~unique_lock(this_00);
    ppBVar4 = filter_index;
    uVar1 = (*ppCVar3)->nHeight;
    _stop_height = (RecursiveMutex *)CONCAT44(uStack_64,uVar1);
    if (uVar1 < start_height) {
      pLVar6 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
      if (bVar5) {
        local_58._M_dataplus._M_p = (pointer)node->id;
        args_1 = &start_height_local;
        source_line = 0xd94;
        fmt = 
        "peer %d sent invalid getcfilters/getcfheaders with start height %d and stop height %d\n";
LAB_008f435d:
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_02._M_len = 0x62;
        logging_function_02._M_str = "PrepareBlockFilterRequest";
        logging_function_02._M_len = 0x19;
        LogPrintFormatInternal<long,unsigned_int,unsigned_int>
                  (logging_function_02,source_file_02,source_line,NET,Debug,
                   (ConstevalFormatString<3U>)fmt,(long *)&local_58,args_1,(uint *)this_00);
      }
LAB_008f418f:
      LOCK();
      (node->fDisconnect)._M_base._M_i = true;
      UNLOCK();
    }
    else {
      if (uVar2 <= uVar1 - start_height) {
        pLVar6 = LogInstance();
        bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
        if (bVar5) {
          local_58._M_dataplus._M_p = (pointer)node->id;
          local_78 = CONCAT44(local_78._4_4_,(uVar1 - start_height) + 1);
          this_00 = (unique_lock<std::recursive_mutex> *)&max_height_diff;
          source_line = 0xd9a;
          fmt = "peer %d requested too many cfilters/cfheaders: %d / %d\n";
          goto LAB_008f435d;
        }
        goto LAB_008f418f;
      }
      pBVar7 = GetBlockFilterIndex(BASIC);
      *ppBVar4 = pBVar7;
      bVar5 = true;
      if (pBVar7 != (BlockFilterIndex *)0x0) goto LAB_008f423f;
      pLVar6 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
      if (bVar5) {
        bVar5 = false;
        args = BlockFilterTypeName_abi_cxx11_(BASIC);
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_01._M_len = 0x62;
        logging_function_01._M_str = "PrepareBlockFilterRequest";
        logging_function_01._M_len = 0x19;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_01,source_file_01,0xda1,NET,Debug,
                   (ConstevalFormatString<1U>)0xf7d15b,args);
        goto LAB_008f423f;
      }
    }
  }
  bVar5 = false;
LAB_008f423f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::PrepareBlockFilterRequest(CNode& node, Peer& peer,
                                                BlockFilterType filter_type, uint32_t start_height,
                                                const uint256& stop_hash, uint32_t max_height_diff,
                                                const CBlockIndex*& stop_index,
                                                BlockFilterIndex*& filter_index)
{
    const bool supported_filter_type =
        (filter_type == BlockFilterType::BASIC &&
         (peer.m_our_services & NODE_COMPACT_FILTERS));
    if (!supported_filter_type) {
        LogDebug(BCLog::NET, "peer %d requested unsupported block filter type: %d\n",
                 node.GetId(), static_cast<uint8_t>(filter_type));
        node.fDisconnect = true;
        return false;
    }

    {
        LOCK(cs_main);
        stop_index = m_chainman.m_blockman.LookupBlockIndex(stop_hash);

        // Check that the stop block exists and the peer would be allowed to fetch it.
        if (!stop_index || !BlockRequestAllowed(stop_index)) {
            LogDebug(BCLog::NET, "peer %d requested invalid block hash: %s\n",
                     node.GetId(), stop_hash.ToString());
            node.fDisconnect = true;
            return false;
        }
    }

    uint32_t stop_height = stop_index->nHeight;
    if (start_height > stop_height) {
        LogDebug(BCLog::NET, "peer %d sent invalid getcfilters/getcfheaders with "
                 "start height %d and stop height %d\n",
                 node.GetId(), start_height, stop_height);
        node.fDisconnect = true;
        return false;
    }
    if (stop_height - start_height >= max_height_diff) {
        LogDebug(BCLog::NET, "peer %d requested too many cfilters/cfheaders: %d / %d\n",
                 node.GetId(), stop_height - start_height + 1, max_height_diff);
        node.fDisconnect = true;
        return false;
    }

    filter_index = GetBlockFilterIndex(filter_type);
    if (!filter_index) {
        LogDebug(BCLog::NET, "Filter index for supported type %s not found\n", BlockFilterTypeName(filter_type));
        return false;
    }

    return true;
}